

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_>::
basic_bson_cursor<jsoncons::bytes_source>
          (basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this,
          bytes_source *source,bson_decode_options *options,allocator<char> *alloc)

{
  uint uVar1;
  basic_staj_visitor<char> *in_RDI;
  allocator<char> *in_stack_00000008;
  bson_decode_options *in_stack_00000010;
  bytes_source *in_stack_00000018;
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *in_stack_00000020;
  
  ser_context::ser_context((ser_context *)(in_RDI + 3));
  basic_staj_cursor<char>::basic_staj_cursor((basic_staj_cursor<char> *)in_RDI);
  (in_RDI->super_basic_json_visitor<char>)._vptr_basic_json_visitor =
       (_func_int **)(basic_bson_cursor<jsoncons::bytes_source,std::allocator<char>>::vtable + 0x18)
  ;
  in_RDI[3].super_basic_json_visitor<char>._vptr_basic_json_visitor =
       (_func_int **)(basic_bson_cursor<jsoncons::bytes_source,std::allocator<char>>::vtable + 0xb8)
  ;
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::
  basic_bson_parser<jsoncons::bytes_source>
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
  basic_staj_visitor<char>::basic_staj_visitor(in_RDI);
  *(undefined1 *)&in_RDI[2].index_ = 0;
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::cursor_mode
            ((basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *)&in_RDI->event_,
             true);
  uVar1 = (*(in_RDI->super_basic_json_visitor<char>)._vptr_basic_json_visitor[3])();
  if ((uVar1 & 1) == 0) {
    (*(in_RDI->super_basic_json_visitor<char>)._vptr_basic_json_visitor[7])();
  }
  return;
}

Assistant:

basic_bson_cursor(Sourceable&& source,
        const bson_decode_options& options = bson_decode_options(),
        const Allocator& alloc = Allocator())
        : parser_(std::forward<Sourceable>(source), options, alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next();
        }
    }